

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicInputCase3::Run(BasicInputCase3 *this)

{
  float *pfVar1;
  long lVar2;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  Vector<float,_4> local_64;
  Vector<float,_4> local_54;
  Vector<float,_2> local_44;
  Vector<float,_3> local_3c;
  undefined4 local_30;
  GLubyte d_1 [4];
  Vector<float,_3> local_24;
  undefined4 local_18;
  uint local_14;
  GLubyte d [4];
  GLuint i;
  BasicInputCase3 *this_local;
  
  _d = this;
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x48,(void *)0x0,0x88e4);
  local_18 = 0x4030201;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,4,&local_18);
  tcu::Vector<float,_3>::Vector(&local_24,5.0,6.0,7.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_24,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x10,0xc,pfVar1);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xffffffffffffffd4,8.0,9.0);
  pfVar1 = tcu::Vector<float,_2>::operator[]((Vector<float,_2> *)&stack0xffffffffffffffd4,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x1c,8,pfVar1);
  local_30 = 0xd0c0b0a;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x24,4,&local_30);
  tcu::Vector<float,_3>::Vector(&local_3c,14.0,15.0,16.0);
  pfVar1 = tcu::Vector<float,_3>::operator[](&local_3c,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x34,0xc,pfVar1);
  tcu::Vector<float,_2>::Vector(&local_44,17.0,18.0);
  pfVar1 = tcu::Vector<float,_2>::operator[](&local_44,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x40,8,pfVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,4,0x1401,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,3);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,3,0x1406,'\0',0x10);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,3);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,2,0x1406,'\0',0x1c);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,3);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,this->m_vbo,0,0x24);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2);
  tcu::Vector<float,_4>::Vector(&local_54,1.0,2.0,3.0,4.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_54.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_54.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_64,5.0,6.0,7.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[1].m_data = local_64.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[1].m_data + 2) = local_64.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_74,8.0,9.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_74.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_74.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_84,10.0,11.0,12.0,13.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xf].m_data = local_84.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xf].m_data + 2) =
       local_84.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_94,14.0,15.0,16.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_94.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_94.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_a4,17.0,18.0,0.0,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x11].m_data = local_a4.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x11].m_data + 2) =
       local_a4.m_data._8_8_;
  lVar2 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, 36 * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 1, 2, 3, 4 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		glBufferSubData(GL_ARRAY_BUFFER, 16, sizeof(Vec3), &Vec3(5.0f, 6.0f, 7.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(Vec2), &Vec2(8.0f, 9.0f)[0]);
		/* */
		{
			GLubyte d[] = { 10, 11, 12, 13 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + 36, sizeof(d), d);
		}
		glBufferSubData(GL_ARRAY_BUFFER, 16 + 36, sizeof(Vec3), &Vec3(14.0f, 15.0f, 16.0f)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 28 + 36, sizeof(Vec2), &Vec2(17.0f, 18.0f)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glEnableVertexAttribArray(1);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_FALSE, 0);
		glVertexAttribBinding(1, 3);
		glVertexAttribFormat(1, 3, GL_FLOAT, GL_FALSE, 16);
		glVertexAttribBinding(2, 3);
		glVertexAttribFormat(2, 2, GL_FLOAT, GL_FALSE, 28);
		glVertexAttribBinding(0, 3);
		glBindVertexBuffer(3, m_vbo, 0, 36);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(2);

		expected_data[0]	  = Vec4(1.0f, 2.0f, 3.0f, 4.0f);
		expected_data[1]	  = Vec4(5.0f, 6.0f, 7.0f, 1.0f);
		expected_data[2]	  = Vec4(8.0f, 9.0f, 0.0f, 1.0f);
		expected_data[0 + 15] = Vec4(10.0f, 11.0f, 12.0f, 13.0f);
		expected_data[1 + 15] = Vec4(14.0f, 15.0f, 16.0f, 1.0f);
		expected_data[2 + 15] = Vec4(17.0f, 18.0f, 0.0f, 1.0f);
		return BasicInputBase::Run();
	}